

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_ManGetClpStats(Cba_Man_t *p,int *nObjs,int *nFins,int *nFons)

{
  int iVar1;
  int iVar2;
  int *pCountN_00;
  int *pCountI_00;
  int *pCountO_00;
  Cba_Ntk_t *p_00;
  Cba_Ntk_t *pRoot;
  int *pCountO;
  int *pCountI;
  int *pCountN;
  int *nFons_local;
  int *nFins_local;
  int *nObjs_local;
  Cba_Man_t *p_local;
  
  iVar1 = Cba_ManNtkNum(p);
  pCountN_00 = (int *)malloc((long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  memset(pCountN_00,0xff,(long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  pCountI_00 = (int *)malloc((long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  memset(pCountI_00,0xff,(long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  pCountO_00 = (int *)malloc((long)(iVar1 + 1) << 2);
  iVar1 = Cba_ManNtkNum(p);
  memset(pCountO_00,0xff,(long)(iVar1 + 1) << 2);
  p_00 = Cba_ManRoot(p);
  Cba_ManGetClpStats_rec(p_00,pCountN_00,pCountI_00,pCountO_00);
  iVar1 = Cba_NtkPioNum(p_00);
  iVar2 = Cba_NtkId(p_00);
  *nObjs = iVar1 + pCountN_00[iVar2];
  iVar1 = Cba_NtkPoNum(p_00);
  iVar2 = Cba_NtkId(p_00);
  *nFins = iVar1 + pCountI_00[iVar2];
  iVar1 = Cba_NtkPiNum(p_00);
  iVar2 = Cba_NtkId(p_00);
  *nFons = iVar1 + pCountO_00[iVar2];
  if (pCountN_00 != (int *)0x0) {
    free(pCountN_00);
  }
  if (pCountI_00 != (int *)0x0) {
    free(pCountI_00);
  }
  if (pCountO_00 != (int *)0x0) {
    free(pCountO_00);
  }
  return;
}

Assistant:

void Cba_ManGetClpStats( Cba_Man_t * p, int * nObjs, int * nFins, int * nFons )
{
    int * pCountN = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    int * pCountI = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    int * pCountO = ABC_FALLOC( int, Cba_ManNtkNum(p) + 1 );
    Cba_Ntk_t * pRoot = Cba_ManRoot(p);
    Cba_ManGetClpStats_rec( pRoot, pCountN, pCountI, pCountO );
    *nObjs = Cba_NtkPioNum(pRoot) + pCountN[Cba_NtkId(pRoot)];
    *nFins = Cba_NtkPoNum(pRoot)  + pCountI[Cba_NtkId(pRoot)];
    *nFons = Cba_NtkPiNum(pRoot)  + pCountO[Cba_NtkId(pRoot)];
    ABC_FREE( pCountN );
    ABC_FREE( pCountI );
    ABC_FREE( pCountO );
}